

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_PeginWitnessTest_Test::TestBody
          (ConfidentialTransaction_PeginWitnessTest_Test *this)

{
  pointer *this_00;
  ByteData256 BVar1;
  ByteData256 BVar2;
  ConfidentialValue CVar3;
  ConfidentialValue CVar4;
  ByteData BVar5;
  ByteData BVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  size_type sVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  char *pcVar13;
  pointer in_stack_fffffffffffff0b8;
  undefined7 in_stack_fffffffffffff0c0;
  undefined1 in_stack_fffffffffffff0c7;
  undefined4 in_stack_fffffffffffff0c8;
  undefined1 in_stack_fffffffffffff0cc;
  undefined1 in_stack_fffffffffffff0cd;
  undefined1 in_stack_fffffffffffff0ce;
  undefined1 in_stack_fffffffffffff0cf;
  pointer in_stack_fffffffffffff0d0;
  undefined5 in_stack_fffffffffffff0d8;
  undefined1 in_stack_fffffffffffff0dd;
  undefined1 in_stack_fffffffffffff0de;
  undefined1 in_stack_fffffffffffff0df;
  undefined8 in_stack_fffffffffffff0e0;
  undefined7 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ef;
  undefined8 in_stack_fffffffffffff0f0;
  undefined8 in_stack_fffffffffffff0f8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar14;
  undefined8 in_stack_fffffffffffff100;
  undefined7 in_stack_fffffffffffff108;
  undefined1 in_stack_fffffffffffff10f;
  undefined8 in_stack_fffffffffffff110;
  undefined8 in_stack_fffffffffffff118;
  undefined7 in_stack_fffffffffffff120;
  undefined1 in_stack_fffffffffffff127;
  undefined8 in_stack_fffffffffffff128;
  undefined8 in_stack_fffffffffffff130;
  undefined7 in_stack_fffffffffffff138;
  undefined1 in_stack_fffffffffffff13f;
  undefined8 in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff148;
  undefined2 in_stack_fffffffffffff14c;
  undefined1 in_stack_fffffffffffff14e;
  undefined1 in_stack_fffffffffffff14f;
  undefined4 in_stack_fffffffffffff150;
  undefined1 in_stack_fffffffffffff154;
  undefined1 in_stack_fffffffffffff155;
  undefined1 in_stack_fffffffffffff156;
  undefined1 in_stack_fffffffffffff157;
  AssertHelper local_d88;
  Message local_d80;
  int local_d78;
  uint local_d74;
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_15;
  Message local_d58;
  AssertHelper local_d50;
  Message local_d48 [2];
  CfdException *anon_var_0_3;
  char *pcStack_d30;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_d20;
  string local_d18 [32];
  undefined1 local_cf8 [8];
  AssertionResult gtest_ar_14;
  Message local_ce0;
  ByteData256 local_cd8;
  AssertHelper local_cc0;
  Message local_cb8;
  string local_cb0 [32];
  string local_c90 [32];
  undefined1 local_c70 [8];
  AssertionResult gtest_ar_13;
  size_t idx_3;
  ScriptWitness local_af8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_ad8;
  AssertHelper local_ac0;
  Message local_ab8;
  string local_ab0 [32];
  string local_a90 [32];
  undefined1 local_a70 [8];
  AssertionResult gtest_ar_12;
  Message local_a58;
  string local_a50 [32];
  string local_a30 [32];
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_11;
  Message local_9f8;
  string local_9f0 [32];
  string local_9d0 [32];
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_988;
  Message local_980;
  ScriptWitness local_978;
  AssertHelper local_958;
  Message local_950;
  ScriptWitness local_948;
  AssertHelper local_928;
  Message local_920;
  ScriptWitness local_918;
  AssertHelper local_8f8;
  Message local_8f0 [2];
  CfdException *anon_var_0_2;
  byte local_8b9;
  char *pcStack_8b8;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_8a8 [2];
  CfdException *anon_var_0_1;
  byte local_871;
  char *pcStack_870;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_860;
  string local_858 [32];
  undefined1 local_838 [8];
  AssertionResult gtest_ar_9;
  Message local_820;
  ByteData256 local_818;
  AssertHelper local_800;
  Message local_7f8;
  unsigned_long local_7f0;
  uint local_7e4;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar_8;
  Message local_7c8;
  string local_7c0 [32];
  string local_7a0 [32];
  undefined1 local_780 [8];
  AssertionResult gtest_ar_7;
  Message local_768;
  string local_760 [32];
  string local_740 [32];
  undefined1 local_720 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_6f8;
  Message local_6f0;
  ScriptWitness local_6e8;
  AssertHelper local_6c8;
  Message local_6c0;
  ScriptWitness local_6b8;
  AssertHelper local_698;
  Message local_690 [2];
  CfdException *anon_var_0;
  byte local_659;
  char *pcStack_658;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_648;
  string local_640 [32];
  undefined1 local_620 [8];
  AssertionResult gtest_ar_5;
  Message local_608;
  ByteData256 local_600;
  AssertHelper local_5e8;
  Message local_5e0;
  size_type local_5d8;
  uint local_5cc;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_4;
  Message local_5b0;
  string local_5a8 [32];
  string local_588 [32];
  undefined1 local_568 [8];
  AssertionResult gtest_ar_3;
  size_t idx_2;
  ScriptWitness local_3f0;
  undefined1 local_3d0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> tx_peg_vector;
  Message local_3b0;
  string local_3a8 [32];
  string local_388 [32];
  undefined1 local_368 [8];
  AssertionResult gtest_ar_2;
  size_t idx_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_peg_vector;
  Message local_330;
  ScriptWitness local_328;
  ulong local_308;
  size_t idx;
  ScriptWitness witness;
  Message local_2d8;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  Message local_298;
  ByteData256 local_290;
  AssertHelper local_278;
  Message local_270;
  int local_268;
  uint local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar;
  Message local_248;
  ByteData local_240;
  ByteData local_228;
  ConfidentialValue local_210;
  ConfidentialValue local_1e8;
  ByteData256 local_1c0;
  ByteData256 local_1a8;
  AssertHelper local_190;
  Message local_188;
  uint local_17c;
  undefined1 local_178 [4];
  uint32_t index;
  ConfidentialTransaction tx;
  undefined1 local_138 [8];
  ByteData256 witness_only_hash;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_peg_vector;
  string local_f8 [32];
  undefined1 local_d8 [8];
  ByteData256 exp_data256;
  string local_b8 [32];
  undefined1 local_98 [8];
  ByteData160 exp_data160;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  ByteData exp_data;
  ScriptWitness exp_pegin_witness;
  ConfidentialTransaction_PeginWitnessTest_Test *this_local;
  
  GetExpectPeginWitnessStack();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"1234567890",&local_69);
  cfd::core::ByteData::ByteData((ByteData *)local_48,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"1234567890123456789012345678901234567890",
             (allocator *)
             ((long)&exp_data256.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData160::ByteData160((ByteData160 *)local_98,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&exp_data256.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,"1234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)((long)&exp_peg_vector + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_d8,local_f8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&exp_peg_vector + 7));
  cfd::core::ScriptWitness::GetWitness();
  this_00 = &witness_only_hash.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_138);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_178,(string *)&exp_tx_hex_abi_cxx11_);
  local_17c = 0;
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      local_17c = cfd::core::ConfidentialTransaction::AddTxIn
                            ((Txid *)local_178,0x67c088,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message(&local_188);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x129,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ByteData256::ByteData256(&local_1a8,&exp_blinding_nonce);
      cfd::core::ByteData256::ByteData256(&local_1c0,&exp_asset_entropy);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1e8,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_210,&exp_inflation_keys);
      cfd::core::ByteData::ByteData(&local_228,&exp_issuance_amount_rangeproof);
      cfd::core::ByteData::ByteData(&local_240,&exp_inflation_keys_rangeproof);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_240;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_228;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff0b8;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff0c7;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_7_ = in_stack_fffffffffffff0c0;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff0c8;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_1_ = in_stack_fffffffffffff0cc;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._5_1_ = in_stack_fffffffffffff0cd;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = in_stack_fffffffffffff0ce;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff0cf;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff0d0;
      CVar3._vptr_ConfidentialValue._5_1_ = in_stack_fffffffffffff0dd;
      CVar3._vptr_ConfidentialValue._0_5_ = in_stack_fffffffffffff0d8;
      CVar3._vptr_ConfidentialValue._6_1_ = in_stack_fffffffffffff0de;
      CVar3._vptr_ConfidentialValue._7_1_ = in_stack_fffffffffffff0df;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff0e0;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffff0e8;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff0ef;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff0f0;
      CVar3._32_8_ = in_stack_fffffffffffff0f8;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_7_ = in_stack_fffffffffffff108;
      CVar4._vptr_ConfidentialValue = (_func_int **)in_stack_fffffffffffff100;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff10f;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff110;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff118;
      CVar4._32_7_ = in_stack_fffffffffffff120;
      CVar4._39_1_ = in_stack_fffffffffffff127;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff130;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff128;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_7_ = in_stack_fffffffffffff138;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_fffffffffffff13f;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffff148;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff140;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._4_2_ = in_stack_fffffffffffff14c;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._6_1_ = in_stack_fffffffffffff14e;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffff14f;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff150;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = in_stack_fffffffffffff154;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_1_ = in_stack_fffffffffffff155;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = in_stack_fffffffffffff156;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = in_stack_fffffffffffff157;
      cfd::core::ConfidentialTransaction::SetIssuance
                ((uint)local_178,BVar1,BVar2,CVar3,CVar4,BVar5,BVar6);
      cfd::core::ByteData::~ByteData(&local_240);
      cfd::core::ByteData::~ByteData(&local_228);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_210);
      cfd::core::ConfidentialValue::~ConfidentialValue(&local_1e8);
      cfd::core::ByteData256::~ByteData256(&local_1c0);
      cfd::core::ByteData256::~ByteData256(&local_1a8);
    }
  }
  else {
    testing::Message::Message(&local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x12e,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_248);
  }
  local_264 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)local_178);
  local_268 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_260,"tx.GetPeginWitnessStackNum(index)","0",&local_264,
             &local_268);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar8) {
    testing::Message::Message(&local_270);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x12f,pcVar10);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      cfd::core::ByteData256::operator=((ByteData256 *)local_138,&local_290);
      cfd::core::ByteData256::~ByteData256(&local_290);
    }
  }
  else {
    testing::Message::Message(&local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x132,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_298);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b0,"witness_only_hash.GetHex().c_str()",
             "\"5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99\"",pcVar10,
             "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");
  std::__cxx11::string::~string(local_2d0);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar8) {
    testing::Message::Message(&local_2d8);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x135,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &witness.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  cfd::core::ScriptWitness::ScriptWitness((ScriptWitness *)&idx);
  for (local_308 = 0; uVar7 = local_308,
      sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          this_00), uVar7 < sVar11; local_308 = local_308 + 1) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      bVar8 = testing::internal::AlwaysTrue();
      if (bVar8) {
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00,
                   local_308);
        cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                  ((uint)&local_328,(ByteData *)local_178);
        cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_328);
        cfd::core::ScriptWitness::~ScriptWitness(&local_328);
      }
    }
    else {
      testing::Message::Message(&local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x13b,
                 "Expected: (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_330);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &test_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_330);
    }
  }
  cfd::core::ScriptWitness::GetWitness();
  for (gtest_ar_2.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar14.ptr_ = gtest_ar_2.message_.ptr_,
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           this_00), sVar14.ptr_ < pbVar12;
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_2.message_.ptr_)->field_0x1) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
               (size_type)gtest_ar_2.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00,
               (size_type)gtest_ar_2.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar13 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_368,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar10,pcVar13);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_388);
    bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar8) {
      testing::Message::Message(&local_3b0);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x140,pcVar10);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &tx_peg_vector.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_3b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  }
  cfd::core::ConfidentialTransaction::GetTxIn((uint)&idx_2);
  cfd::core::ConfidentialTxInReference::GetPeginWitness
            (&local_3f0,(ConfidentialTxInReference *)&idx_2);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ScriptWitness::~ScriptWitness(&local_3f0);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&idx_2);
  for (gtest_ar_3.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar14.ptr_ = gtest_ar_3.message_.ptr_,
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           local_3d0), sVar14.ptr_ < pbVar12;
      gtest_ar_3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_3.message_.ptr_)->field_0x1) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
               (size_type)gtest_ar_3.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0,
               (size_type)gtest_ar_3.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar13 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_568,"test_peg_vector[idx].GetHex().c_str()",
               "tx_peg_vector[idx].GetHex().c_str()",pcVar10,pcVar13);
    std::__cxx11::string::~string(local_5a8);
    std::__cxx11::string::~string(local_588);
    bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
    if (!bVar8) {
      testing::Message::Message(&local_5b0);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x146,pcVar10);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_5b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_5b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  }
  local_5cc = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)local_178);
  local_5d8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         this_00);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_5c8,"tx.GetPeginWitnessStackNum(index)",
             "exp_peg_vector.size()",&local_5cc,&local_5d8);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar8) {
    testing::Message::Message(&local_5e0);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_5c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x148,pcVar10);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      cfd::core::ByteData256::operator=((ByteData256 *)local_138,&local_600);
      cfd::core::ByteData256::~ByteData256(&local_600);
    }
  }
  else {
    testing::Message::Message(&local_608);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x14b,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_608);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_620,"witness_only_hash.GetHex().c_str()",
             "\"7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a\"",pcVar10,
             "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");
  std::__cxx11::string::~string(local_640);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar8) {
    testing::Message::Message(&local_648);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x14e,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff9a8,"");
  bVar8 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff9a8);
  if (bVar8) {
    local_659 = 0;
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((uint)&anon_var_0,(ByteData160 *)local_178);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0);
    }
    if ((local_659 & 1) == 0) {
      pcStack_658 = 
      "Expected: (witness = tx.AddPeginWitnessStack(index + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0043b4ac;
    }
  }
  else {
LAB_0043b4ac:
    testing::Message::Message(local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_698,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x152,pcStack_658);
    testing::internal::AssertHelper::operator=(&local_698,local_690);
    testing::internal::AssertHelper::~AssertHelper(&local_698);
    testing::Message::~Message(local_690);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((uint)&local_6b8,(ByteData160 *)local_178);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_6b8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_6b8);
    }
  }
  else {
    testing::Message::Message(&local_6c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x153,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    testing::Message::~Message(&local_6c0);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack
                ((uint)&local_6e8,(ByteData256 *)local_178);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_6e8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_6e8);
    }
  }
  else {
    testing::Message::Message(&local_6f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x154,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    testing::Message::~Message(&local_6f0);
  }
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData160::GetHex_abi_cxx11_();
  pcVar13 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_720,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar10,pcVar13);
  std::__cxx11::string::~string(local_760);
  std::__cxx11::string::~string(local_740);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar8) {
    testing::Message::Message(&local_768);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x157,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,sVar11 + 1)
  ;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar13 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_780,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar10,pcVar13);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string(local_7a0);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar8) {
    testing::Message::Message(&local_7c8);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x159,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_7c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7e4 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)local_178);
  sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  local_7f0 = sVar11 + 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_7e0,"tx.GetPeginWitnessStackNum(index)",
             "exp_peg_vector.size() + 2",&local_7e4,&local_7f0);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e0);
  if (!bVar8) {
    testing::Message::Message(&local_7f8);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_7e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_800,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15a,pcVar10);
    testing::internal::AssertHelper::operator=(&local_800,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper(&local_800);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e0);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      cfd::core::ByteData256::operator=((ByteData256 *)local_138,&local_818);
      cfd::core::ByteData256::~ByteData256(&local_818);
    }
  }
  else {
    testing::Message::Message(&local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15d,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_820);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_838,"witness_only_hash.GetHex().c_str()",
             "\"ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf\"",pcVar10,
             "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");
  std::__cxx11::string::~string(local_858);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar8) {
    testing::Message::Message(&local_860);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x160,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff790,"");
  bVar8 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff790);
  if (bVar8) {
    local_871 = 0;
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      uVar9 = local_17c + 5;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&anon_var_0_1,(uint)local_178,(ByteData160 *)(ulong)uVar9);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0_1);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_1);
    }
    if ((local_871 & 1) == 0) {
      pcStack_870 = 
      "Expected: (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()), exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0043c17a;
    }
  }
  else {
LAB_0043c17a:
    testing::Message::Message(local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x166,pcStack_870);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_8a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_8a8);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff748,"");
  bVar8 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff748);
  if (bVar8) {
    local_8b9 = 0;
    bVar8 = testing::internal::AlwaysTrue();
    uVar9 = local_17c;
    if (bVar8) {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&anon_var_0_2,(uint)local_178,(ByteData160 *)(ulong)uVar9);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,(ScriptWitness *)&anon_var_0_2);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_2);
    }
    if ((local_8b9 & 1) == 0) {
      pcStack_8b8 = 
      "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0043c372;
    }
  }
  else {
LAB_0043c372:
    testing::Message::Message(local_8f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16a,pcStack_8b8);
    testing::internal::AssertHelper::operator=(&local_8f8,local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    testing::Message::~Message(local_8f0);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&local_918,(uint)local_178,(ByteData *)(ulong)local_17c);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_918);
      cfd::core::ScriptWitness::~ScriptWitness(&local_918);
    }
  }
  else {
    testing::Message::Message(&local_920);
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16b,
               "Expected: (witness = tx.SetPeginWitnessStack(index, 0, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    testing::Message::~Message(&local_920);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      uVar9 = local_17c;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&local_948,(uint)local_178,(ByteData256 *)(ulong)uVar9);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_948);
      cfd::core::ScriptWitness::~ScriptWitness(&local_948);
    }
  }
  else {
    testing::Message::Message(&local_950);
    testing::internal::AssertHelper::AssertHelper
              (&local_958,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16e,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()), exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_958,&local_950);
    testing::internal::AssertHelper::~AssertHelper(&local_958);
    testing::Message::~Message(&local_950);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      uVar9 = local_17c;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&local_978,(uint)local_178,(ByteData160 *)(ulong)uVar9);
      cfd::core::ScriptWitness::operator=((ScriptWitness *)&idx,&local_978);
      cfd::core::ScriptWitness::~ScriptWitness(&local_978);
    }
  }
  else {
    testing::Message::Message(&local_980);
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x171,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_988,&local_980);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::Message::~Message(&local_980);
  }
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_10.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar13 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9b0,"test_peg_vector[0].GetHex().c_str()","exp_data.GetHex().c_str()"
             ,pcVar10,pcVar13);
  std::__cxx11::string::~string(local_9f0);
  std::__cxx11::string::~string(local_9d0);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar8) {
    testing::Message::Message(&local_9f8);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x173,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_9f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_9f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar13 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a10,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar10,pcVar13);
  std::__cxx11::string::~string(local_a50);
  std::__cxx11::string::~string(local_a30);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
  if (!bVar8) {
    testing::Message::Message(&local_a58);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x175,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
  sVar11 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)this_00);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,sVar11 + 1)
  ;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData160::GetHex_abi_cxx11_();
  pcVar13 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a70,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar10,pcVar13);
  std::__cxx11::string::~string(local_ab0);
  std::__cxx11::string::~string(local_a90);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar8) {
    testing::Message::Message(&local_ab8);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              (&local_ac0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x177,pcVar10);
    testing::internal::AssertHelper::operator=(&local_ac0,&local_ab8);
    testing::internal::AssertHelper::~AssertHelper(&local_ac0);
    testing::Message::~Message(&local_ab8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  cfd::core::ConfidentialTransaction::GetTxIn((uint)&idx_3);
  cfd::core::ConfidentialTxInReference::GetPeginWitness
            (&local_af8,(ConfidentialTxInReference *)&idx_3);
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0,
             &local_ad8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_ad8);
  cfd::core::ScriptWitness::~ScriptWitness(&local_af8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&idx_3);
  gtest_ar_13.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while (sVar14.ptr_ = gtest_ar_13.message_.ptr_,
        pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                             local_3d0), sVar14.ptr_ < pbVar12) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1,
               (size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar10 = (char *)std::__cxx11::string::c_str();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0,
               (size_type)gtest_ar_13.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar13 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_c70,"test_peg_vector[idx].GetHex().c_str()",
               "tx_peg_vector[idx].GetHex().c_str()",pcVar10,pcVar13);
    std::__cxx11::string::~string(local_cb0);
    std::__cxx11::string::~string(local_c90);
    bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c70);
    if (!bVar8) {
      testing::Message::Message(&local_cb8);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_c70);
      testing::internal::AssertHelper::AssertHelper
                (&local_cc0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x17b,pcVar10);
      testing::internal::AssertHelper::operator=(&local_cc0,&local_cb8);
      testing::internal::AssertHelper::~AssertHelper(&local_cc0);
      testing::Message::~Message(&local_cb8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c70);
    gtest_ar_13.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(gtest_ar_13.message_.ptr_)->field_0x1;
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      cfd::core::ByteData256::operator=((ByteData256 *)local_138,&local_cd8);
      cfd::core::ByteData256::~ByteData256(&local_cd8);
    }
  }
  else {
    testing::Message::Message(&local_ce0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17f,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_ce0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_ce0);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar10 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_cf8,"witness_only_hash.GetHex().c_str()",
             "\"28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa\"",pcVar10,
             "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");
  std::__cxx11::string::~string(local_d18);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cf8);
  if (!bVar8) {
    testing::Message::Message(&local_d20);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_cf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x182,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,&local_d20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cf8);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff2d0,"");
  bVar8 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff2d0);
  if (bVar8) {
    anon_var_0_3._7_1_ = 0;
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll((uint)local_178);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) goto LAB_0043d56a;
    pcStack_d30 = 
    "Expected: (tx.RemovePeginWitnessStackAll(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_d48);
  testing::internal::AssertHelper::AssertHelper
            (&local_d50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x185,pcStack_d30);
  testing::internal::AssertHelper::operator=(&local_d50,local_d48);
  testing::internal::AssertHelper::~AssertHelper(&local_d50);
  testing::Message::~Message(local_d48);
LAB_0043d56a:
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll((uint)local_178);
    }
  }
  else {
    testing::Message::Message(&local_d58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x186,
               "Expected: (tx.RemovePeginWitnessStackAll(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_d58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_d58);
  }
  local_d74 = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)local_178);
  local_d78 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_d70,"tx.GetPeginWitnessStackNum(index)","0",&local_d74,
             &local_d78);
  bVar8 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d70);
  if (!bVar8) {
    testing::Message::Message(&local_d80);
    pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)local_d70);
    testing::internal::AssertHelper::AssertHelper
              (&local_d88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x187,pcVar10);
    testing::internal::AssertHelper::operator=(&local_d88,&local_d80);
    testing::internal::AssertHelper::~AssertHelper(&local_d88);
    testing::Message::~Message(&local_d80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d70);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_3d0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx_1);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&idx);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_178)
  ;
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_138);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &witness_only_hash.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_d8);
  cfd::core::ByteData160::~ByteData160((ByteData160 *)local_98);
  cfd::core::ByteData::~ByteData((ByteData *)local_48);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTransaction, PeginWitnessTest) {
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  const ByteData160 exp_data160("1234567890123456789012345678901234567890");
  const ByteData256 exp_data256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  ByteData256 witness_only_hash = ByteData256();

  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");

  // AddPeginWitness
  ScriptWitness witness;
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_NO_THROW(
        (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])));
  }
  std::vector<ByteData> test_peg_vector = witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 exp_peg_vector[idx].GetHex().c_str());
  }
  std::vector<ByteData> tx_peg_vector = tx.GetTxIn(index).GetPeginWitness()
      .GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size());

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");

  // AddPeginWitness(160,256)
  EXPECT_THROW((witness = tx.AddPeginWitnessStack(index + 5, exp_data160)),
               CfdException);
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data160)));
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data256)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size() + 2);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");

  // SetPeginWitnessStack
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data160)),
      CfdException);
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5,
                                         exp_data160)),
      CfdException);
  EXPECT_NO_THROW((witness = tx.SetPeginWitnessStack(index, 0, exp_data)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data256)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1,
                                         exp_data160)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[0].GetHex().c_str(), exp_data.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  tx_peg_vector = tx.GetTxIn(index).GetPeginWitness().GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");

  // RemovePeginWitnessStackAll
  EXPECT_THROW((tx.RemovePeginWitnessStackAll(index + 5)), CfdException);
  EXPECT_NO_THROW((tx.RemovePeginWitnessStackAll(index)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);
}